

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O0

void start_iMCU_row(j_decompress_ptr cinfo)

{
  jpeg_d_coef_controller *pjVar1;
  my_coef_ptr_conflict coef;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->coef;
  if (cinfo->comps_in_scan < 2) {
    if (cinfo->input_iMCU_row < cinfo->total_iMCU_rows - 1) {
      *(int *)&pjVar1[1].consume_data = cinfo->cur_comp_info[0]->v_samp_factor;
    }
    else {
      *(int *)&pjVar1[1].consume_data = cinfo->cur_comp_info[0]->last_row_height;
    }
  }
  else {
    *(undefined4 *)&pjVar1[1].consume_data = 1;
  }
  *(undefined4 *)&pjVar1[1].start_input_pass = 0;
  *(undefined4 *)((long)&pjVar1[1].start_input_pass + 4) = 0;
  return;
}

Assistant:

LOCAL(void)
start_iMCU_row(j_compress_ptr cinfo)
/* Reset within-iMCU-row counters for a new row */
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;

  /* In an interleaved scan, an MCU row is the same as an iMCU row.
   * In a noninterleaved scan, an iMCU row has v_samp_factor MCU rows.
   * But at the bottom of the image, process only what's left.
   */
  if (cinfo->comps_in_scan > 1) {
    coef->MCU_rows_per_iMCU_row = 1;
  } else {
    if (coef->iMCU_row_num < (cinfo->total_iMCU_rows - 1))
      coef->MCU_rows_per_iMCU_row = cinfo->cur_comp_info[0]->v_samp_factor;
    else
      coef->MCU_rows_per_iMCU_row = cinfo->cur_comp_info[0]->last_row_height;
  }

  coef->mcu_ctr = 0;
  coef->MCU_vert_offset = 0;
}